

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

void __thiscall
cmOutputRequiredFilesCommand::ListDependencies
          (cmOutputRequiredFilesCommand *this,cmDependInformation *info,FILE *fout,
          set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
          *visited)

{
  FILE *this_00;
  bool bVar1;
  reference ppcVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool local_e9;
  string local_e0 [35];
  byte local_bd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long local_90;
  size_type pos;
  string tmp;
  _Self local_60;
  cmDependInformation *local_58;
  cmDependInformation *d;
  iterator __end1;
  iterator __begin1;
  DependencySetType *__range1;
  set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
  *visited_local;
  FILE *fout_local;
  cmDependInformation *info_local;
  cmOutputRequiredFilesCommand *this_local;
  
  fout_local = (FILE *)info;
  info_local = (cmDependInformation *)this;
  std::
  set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
  ::insert(visited,(value_type *)&fout_local);
  this_00 = fout_local;
  __end1 = std::
           set<cmDependInformation_*,_std::less<cmDependInformation_*>,_std::allocator<cmDependInformation_*>_>
           ::begin((set<cmDependInformation_*,_std::less<cmDependInformation_*>,_std::allocator<cmDependInformation_*>_>
                    *)fout_local);
  d = (cmDependInformation *)
      std::
      set<cmDependInformation_*,_std::less<cmDependInformation_*>,_std::allocator<cmDependInformation_*>_>
      ::end((set<cmDependInformation_*,_std::less<cmDependInformation_*>,_std::allocator<cmDependInformation_*>_>
             *)this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&d), bVar1) {
    ppcVar2 = std::_Rb_tree_const_iterator<cmDependInformation_*>::operator*(&__end1);
    local_58 = *ppcVar2;
    local_60._M_node =
         (_Base_ptr)
         std::
         set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
         ::find(visited,&local_58);
    tmp.field_2._8_8_ =
         std::
         set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
         ::end(visited);
    bVar1 = std::operator==(&local_60,(_Self *)((long)&tmp.field_2 + 8));
    if (bVar1) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::string((string *)&pos,(string *)&local_58->FullPath);
        local_90 = std::__cxx11::string::rfind((char)&pos,0x2e);
        local_bd = 0;
        local_e9 = false;
        if (local_90 != -1) {
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)&pos);
          local_bd = 1;
          local_e9 = std::operator!=(&local_b0,".h");
        }
        if ((local_bd & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_b0);
        }
        if (local_e9 != false) {
          std::__cxx11::string::substr((ulong)local_e0,(ulong)&pos);
          std::__cxx11::string::operator=((string *)&pos,local_e0);
          std::__cxx11::string::~string(local_e0);
          uVar4 = std::__cxx11::string::c_str();
          fprintf((FILE *)fout,"%s\n",uVar4);
        }
        std::__cxx11::string::~string((string *)&pos);
      }
      ListDependencies(this,local_58,fout,visited);
    }
    std::_Rb_tree_const_iterator<cmDependInformation_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void cmOutputRequiredFilesCommand::ListDependencies(
  cmDependInformation const* info, FILE* fout,
  std::set<cmDependInformation const*>* visited)
{
  // add info to the visited set
  visited->insert(info);
  // now recurse with info's dependencies
  for (cmDependInformation* d : info->DependencySet) {
    if (visited->find(d) == visited->end()) {
      if (!info->FullPath.empty()) {
        std::string tmp = d->FullPath;
        std::string::size_type pos = tmp.rfind('.');
        if (pos != std::string::npos && (tmp.substr(pos) != ".h")) {
          tmp = tmp.substr(0, pos);
          fprintf(fout, "%s\n", d->FullPath.c_str());
        }
      }
      this->ListDependencies(d, fout, visited);
    }
  }
}